

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O0

void __thiscall utf8_valid_2_bytes_Test::TestBody(utf8_valid_2_bytes_Test *this)

{
  bool expected;
  undefined4 local_18;
  int iStack_14;
  bool is_valid;
  int cu1;
  int cu0;
  utf8_valid_2_bytes_Test *this_local;
  
  for (iStack_14 = 0xc2; iStack_14 < 0xe0; iStack_14 = iStack_14 + 1) {
    for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
      expected = anon_unknown.dwarf_9556a::is_in_range(local_18,0x80,0xc0);
      anon_unknown.dwarf_9556a::assert_is_valid_utf8(expected,2,iStack_14,local_18,0,0);
    }
  }
  return;
}

Assistant:

TEST(utf8, valid_2_bytes) {
  FOR_RANGE(cu0, 0xc2, 0xe0) {
    FOR_EACH_BYTE(cu1) {
      bool is_valid = is_in_range(cu1, 0x80, 0xc0);
      assert_is_valid_utf8(is_valid, 2, cu0, cu1);
    }
  }
}